

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsequentialanimationgroup.cpp
# Opt level: O1

void __thiscall
QSequentialAnimationGroupPrivate::rewindForwards
          (QSequentialAnimationGroupPrivate *this,AnimationIndex *newAnimationIndex)

{
  int iVar1;
  QAbstractAnimation *pQVar2;
  bool bVar3;
  parameter_type pVar4;
  long lVar5;
  
  iVar1 = this->lastLoop;
  pVar4 = QObjectCompatProperty<QAbstractAnimationPrivate,_int,_&QAbstractAnimationPrivate::_qt_property_currentLoop_offset,_nullptr,_&QAbstractAnimationPrivate::emitCurrentLoopChanged,_nullptr>
          ::value(&(this->super_QAnimationGroupPrivate).super_QAbstractAnimationPrivate.currentLoop)
  ;
  if (pVar4 < iVar1) {
    lVar5 = (long)this->currentAnimationIndex;
    if (-1 < (long)this->currentAnimationIndex) {
      do {
        pQVar2 = (QAbstractAnimation *)(this->super_QAnimationGroupPrivate).animations.d.ptr[lVar5];
        setCurrentAnimation(this,(int)lVar5,true);
        QAbstractAnimation::setCurrentTime(pQVar2,0);
        bVar3 = 0 < lVar5;
        lVar5 = lVar5 + -1;
      } while (bVar3);
    }
    lVar5 = (this->super_QAnimationGroupPrivate).animations.d.size;
    if (lVar5 == 1) {
      activateCurrentAnimation(this,false);
    }
    else {
      setCurrentAnimation(this,(int)lVar5 + -1,true);
    }
  }
  lVar5 = (long)this->currentAnimationIndex;
  if (newAnimationIndex->index < this->currentAnimationIndex) {
    do {
      pQVar2 = (QAbstractAnimation *)(this->super_QAnimationGroupPrivate).animations.d.ptr[lVar5];
      setCurrentAnimation(this,(int)lVar5,true);
      QAbstractAnimation::setCurrentTime(pQVar2,0);
      lVar5 = lVar5 + -1;
    } while (newAnimationIndex->index < lVar5);
  }
  return;
}

Assistant:

void QSequentialAnimationGroupPrivate::rewindForwards(const AnimationIndex &newAnimationIndex)
{
    if (lastLoop > currentLoop) {
        // we need to fast rewind to the beginning
        for (int i = currentAnimationIndex; i >= 0 ; --i) {
            QAbstractAnimation *anim = animations.at(i);
            setCurrentAnimation(i, true);
            anim->setCurrentTime(0);
        }
        // this will make sure the current animation is reset to the end
        if (animations.size() == 1)
            // we need to force activation because setCurrentAnimation will have no effect
            activateCurrentAnimation();
        else
            setCurrentAnimation(animations.size() - 1, true);
    }

    // and now we need to fast rewind from the current position to
    for (int i = currentAnimationIndex; i > newAnimationIndex.index; --i) {
        QAbstractAnimation *anim = animations.at(i);
        setCurrentAnimation(i, true);
        anim->setCurrentTime(0);
    }
    // setting the new current animation will happen later
}